

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O0

double __thiscall
iaf_psc_alpha::propagator_31(iaf_psc_alpha *this,double tau_syn,double tau,double C,double h)

{
  double dVar1;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double de31;
  double P31_singular;
  double P31;
  double P31_linear;
  double local_8;
  
  dVar1 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  exp(-in_XMM3_Qa / dVar1);
  dVar2 = exp(-in_XMM3_Qa / in_XMM0_Qa);
  dVar3 = expm1(-in_XMM3_Qa / dVar1 + in_XMM3_Qa / in_XMM0_Qa);
  dVar4 = exp(-in_XMM3_Qa / in_XMM0_Qa);
  local_8 = (((1.0 / in_XMM2_Qa) *
             (((dVar2 * dVar3) / (dVar1 / in_XMM0_Qa - 1.0)) * dVar1 + -(in_XMM3_Qa * dVar4))) /
            (-1.0 - -dVar1 / in_XMM0_Qa)) * dVar1;
  dVar2 = exp(-in_XMM3_Qa / dVar1);
  std::abs(in_EDI);
  if (((dVar1 == in_XMM0_Qa) && (!NAN(dVar1) && !NAN(in_XMM0_Qa))) ||
     ((std::abs(in_EDI), extraout_XMM0_Qa_00 < 0.1 &&
      (std::abs(in_EDI), extraout_XMM0_Qa_01 * 2.0 < extraout_XMM0_Qa)))) {
    local_8 = (((in_XMM3_Qa * in_XMM3_Qa) / 2.0) / in_XMM2_Qa) * dVar2;
  }
  return local_8;
}

Assistant:

double iaf_psc_alpha::propagator_31( double tau_syn, double tau, double C, double h )
{
  const double P31_linear = 1 / ( 3. * C * tau * tau ) * h * h * h * ( tau_syn - tau ) * std::exp( -h / tau );
  const double P31 =
    1 / C * ( std::exp( -h / tau_syn ) * std::expm1( -h / tau + h / tau_syn ) / ( tau / tau_syn - 1 ) * tau
              - h * std::exp( -h / tau_syn ) ) / ( -1 - -tau / tau_syn ) * tau;
  const double P31_singular = h * h / 2 / C * std::exp( -h / tau );
  const double de31 = std::abs( P31 - P31_singular );

  if ( tau == tau_syn or ( std::abs( tau - tau_syn ) < 0.1 and de31 > 2 * std::abs( P31_linear ) ) )
  {
    return P31_singular;
  }
  else
  {
    return P31;
  }
}